

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

shared_ptr<LNode> __thiscall LParser::shift_VAR(LParser *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  LParser *in_RSI;
  shared_ptr<LNode> sVar1;
  undefined1 local_2c [12];
  shared_ptr<LNodeData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  r;
  LParser *this_local;
  
  local_2c._0_4_ = 0x1d;
  std::__shared_ptr_access<LToken,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<LToken,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)&in_RSI->peek)
  ;
  std::make_shared<LNodeData<std::__cxx11::string>,LNodeType,std::__cxx11::string&>
            ((LNodeType *)(local_2c + 4),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c);
  move(in_RSI);
  std::shared_ptr<LNode>::shared_ptr<LNodeData<std::__cxx11::string>,void>
            ((shared_ptr<LNode> *)this,
             (shared_ptr<LNodeData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_2c + 4));
  std::
  shared_ptr<LNodeData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~shared_ptr((shared_ptr<LNodeData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2c + 4));
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<LNode>)sVar1.super___shared_ptr<LNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<LNode> LParser::shift_VAR() {
    auto r = std::make_shared<LNodeData<std::string>>(LNodeType::VAR, this->peek->token);
    this->move();
    return r;
}